

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcxx_eh.cc
# Opt level: O0

void test_cxx_eh_implementation(void)

{
  bool bVar1;
  MagicValueHolder anon_var_0;
  bool caught;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&(anonymous_namespace)::done_setup);
  if (!bVar1) {
    eh_trampoline();
    __assert_fail("caught",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/objcxx_eh.cc"
                  ,0x135,"void test_cxx_eh_implementation()");
  }
  return;
}

Assistant:

void test_cxx_eh_implementation()
{
	if (done_setup)
	{
		return;
	}
	bool caught = false;
	try
	{
		eh_trampoline();
	}
	catch(MagicValueHolder)
	{
		caught = true;
	}
	assert(caught);
}